

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_transport_pc.c
# Opt level: O2

int ll_tty_open(char *dev_name,int baudrate)

{
  ssize_t sVar1;
  int iVar2;
  char *__file;
  undefined1 local_61;
  termios local_60;
  
  if (-1 < g_tty_fd) {
    printf("ll_tty_open: already open.");
    ll_tty_close();
  }
  iVar2 = -1;
  if ((baudrate == 0x1c200) || (baudrate == 0)) {
    __file = "/dev/ttyUSB0";
    if (dev_name != (char *)0x0) {
      __file = dev_name;
    }
    g_tty_fd = open(__file,0x101902);
    if (g_tty_fd < 0) {
      perror("ll_tty_open");
    }
    else {
      printf("Open %s baud %d\n",__file,0x1c200);
      tcgetattr(g_tty_fd,&local_60);
      local_60._0_8_ = local_60._0_8_ & 0xffffffb2ffffea02;
      local_60.c_cflag = local_60.c_cflag & 0x7ffff20f | 0xcb0;
      local_60.c_lflag = local_60.c_lflag & 0xffff7f34;
      local_60.c_cc[0] = '\0';
      local_60.c_cc[1] = '\0';
      local_60.c_cc[2] = '\0';
      local_60.c_cc[3] = '\0';
      local_60.c_cc[4] = '\0';
      local_60.c_cc[5] = '\0';
      local_60.c_cc[6] = '\0';
      local_60.c_cc[7] = '\0';
      local_60.c_cc[8] = '\0';
      local_60.c_cc[9] = '\0';
      local_60.c_cc[10] = '\0';
      local_60.c_cc[0xb] = '\0';
      local_60.c_cc[0xc] = '\0';
      local_60.c_cc[0xd] = '\0';
      local_60.c_cc[0xe] = '\0';
      local_60.c_cc[0xf] = '\0';
      local_60.c_cc[0x10] = '\0';
      local_60.c_cc[0x11] = '\0';
      local_60.c_cc[0x12] = '\0';
      local_60.c_cc[0x13] = '\0';
      local_60.c_cc[0x14] = '\0';
      local_60.c_cc[0x15] = '\0';
      local_60.c_cc[0x16] = '\0';
      local_60.c_cc[0x17] = '\0';
      local_60.c_cc[0x18] = '\0';
      local_60.c_cc[0x19] = '\0';
      local_60.c_cc[0x1a] = '\0';
      local_60.c_cc[0x1b] = '\0';
      local_60.c_cc[0x1c] = '\0';
      local_60.c_cc[0x1d] = '\0';
      local_60.c_cc[0x1e] = '\0';
      local_60.c_cc[0x1f] = '\0';
      cfsetspeed(&local_60,0x1002);
      tcsetattr(g_tty_fd,2,&local_60);
      tcflow(g_tty_fd,3);
      do {
        if (g_tty_fd < 0) goto LAB_00106914;
        sVar1 = read(g_tty_fd,&local_61,1);
        if (sVar1 == 0) goto LAB_00106914;
      } while (-1 < sVar1);
      perror("Error flushing CF UART");
LAB_00106914:
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ll_tty_open(const char *dev_name, int baudrate)
{
    if (g_tty_fd >= 0)
    {
        printf("ll_tty_open: already open.");
		ll_tty_close();
    }
	if (baudrate == 0) 
	{
		baudrate = LL_TTY_DEFAULT_BAUDRATE;
    }
    else if (baudrate != LL_TTY_DEFAULT_BAUDRATE)
    {
        return(-1);
    }
    if (dev_name == NULL)
    {
        dev_name = LL_TTY_DEFAULT_DEVICE;
    }

    g_tty_fd = open(dev_name, O_RDWR | O_NOCTTY | O_SYNC | O_NDELAY);
    if(g_tty_fd < 0)
    {
        perror("ll_tty_open");
        return(-1);
    }
    printf("Open %s baud %d\n", dev_name, baudrate);

    /* Turn off blocking for reads, use (g_tty_fd, F_SETFL, FNDELAY) if you want that */
    struct termios tc;
    tcgetattr(g_tty_fd, &tc);

    /* input flags */
    tc.c_iflag &= ~ IGNBRK; /* enable ignoring break */
    tc.c_iflag &= ~(IGNPAR | PARMRK); /* disable parity checks */
    tc.c_iflag &= ~ INPCK; /* disable parity checking */
    tc.c_iflag &= ~ ISTRIP; /* disable stripping 8th bit */
    tc.c_iflag &= ~(INLCR | ICRNL); /* disable translating NL <-> CR */
    tc.c_iflag &= ~ IGNCR; /* disable ignoring CR */
    tc.c_iflag &= ~(IXON | IXOFF); /* disable XON/XOFF flow control */
    /* output flags */
    tc.c_oflag &= ~ OPOST; /* disable output processing */
    tc.c_oflag &= ~(ONLCR | OCRNL); /* disable translating NL <-> CR */
    /* not for FreeBSD */
    tc.c_oflag &= ~ OFILL; /* disable fill characters */
    /* control flags */
    tc.c_cflag |= CLOCAL; /* prevent changing ownership */
    tc.c_cflag |= CREAD; /* enable reciever */
    tc.c_cflag &= ~ PARENB; /* disable parity */
    tc.c_cflag &= ~ CSTOPB; /* disable 2 stop bits */
    tc.c_cflag &= ~ CSIZE; /* remove size flag... */
    tc.c_cflag |= CS8; /* ...enable 8 bit characters */
    tc.c_cflag |= HUPCL; /* enable lower control lines on close - hang up */
    tc.c_cflag &= ~ CRTSCTS; /* disable hardware CTS/RTS flow control */
    /* local flags */
    tc.c_lflag &= ~ ISIG; /* disable generating signals */
    tc.c_lflag &= ~ ICANON; /* disable canonical mode - line by line */
    tc.c_lflag &= ~ ECHO; /* disable echoing characters */
    tc.c_lflag &= ~ ECHONL; /* ??? */
    tc.c_lflag &= ~ NOFLSH; /* disable flushing on SIGINT */
    tc.c_lflag &= ~ IEXTEN; /* disable input processing */

    /* control characters */
    memset(tc.c_cc,0,sizeof(tc.c_cc));

    /* set i/o baud rate */
    cfsetspeed(&tc, B115200);
    tcsetattr(g_tty_fd, TCSAFLUSH, &tc);

    /* enable input & output transmission */
    tcflow(g_tty_fd, TCOON | TCION);

	ll_tty_flush();
    return(0);
}